

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_write_tag_handle(yaml_emitter_t *emitter,yaml_char_t *value,size_t length)

{
  yaml_char_t yVar1;
  yaml_char_t *pyVar2;
  int iVar3;
  yaml_char_t *pyVar4;
  yaml_string_t string;
  size_t length_local;
  yaml_char_t *value_local;
  yaml_emitter_t *emitter_local;
  
  string.end = value;
  if (emitter->whitespace == 0) {
    if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
       (iVar3 = yaml_emitter_flush(emitter), iVar3 == 0)) {
      return 0;
    }
    pyVar2 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar2 + 1;
    *pyVar2 = ' ';
    emitter->column = emitter->column + 1;
  }
  while( true ) {
    if (string.end == value + length) {
      emitter->whitespace = 0;
      emitter->indention = 0;
      return 1;
    }
    if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
       (iVar3 = yaml_emitter_flush(emitter), iVar3 == 0)) break;
    if ((*string.end & 0x80) == 0) {
      yVar1 = *string.end;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      string.end = string.end + 1;
    }
    else if ((*string.end & 0xe0) == 0xc0) {
      pyVar4 = string.end + 1;
      yVar1 = *string.end;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      string.end = string.end + 2;
      yVar1 = *pyVar4;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
    }
    else if ((*string.end & 0xf0) == 0xe0) {
      yVar1 = *string.end;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      pyVar4 = string.end + 2;
      yVar1 = string.end[1];
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      string.end = string.end + 3;
      yVar1 = *pyVar4;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
    }
    else if ((*string.end & 0xf8) == 0xf0) {
      yVar1 = *string.end;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      yVar1 = string.end[1];
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      pyVar4 = string.end + 3;
      yVar1 = string.end[2];
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
      string.end = string.end + 4;
      yVar1 = *pyVar4;
      pyVar2 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar2 + 1;
      *pyVar2 = yVar1;
    }
    emitter->column = emitter->column + 1;
  }
  return 0;
}

Assistant:

static int
yaml_emitter_write_tag_handle(yaml_emitter_t *emitter,
        yaml_char_t *value, size_t length)
{
    yaml_string_t string;
    STRING_ASSIGN(string, value, length);

    if (!emitter->whitespace) {
        if (!PUT(emitter, ' ')) return 0;
    }

    while (string.pointer != string.end) {
        if (!WRITE(emitter, string)) return 0;
    }

    emitter->whitespace = 0;
    emitter->indention = 0;

    return 1;
}